

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.cc
# Opt level: O3

void __thiscall Array::Array(Array *this,int sz)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  vector<int,_std::allocator<int>_> *pvVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  undefined1 local_2d;
  int local_2c;
  vector<int,_std::allocator<int>_> *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  (this->theArray).
  super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->theArray).
  super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->totSize = sz;
  this->theSize = 0;
  if (0 < sz) {
    local_28 = (element_type *)0x0;
    local_2c = sz;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>,int&>
              (a_Stack_20,&local_28,(allocator<std::vector<int,_std::allocator<int>_>_> *)&local_2d,
               &local_2c);
    _Var2._M_pi = a_Stack_20[0]._M_pi;
    pvVar1 = local_28;
    local_28 = (vector<int,_std::allocator<int>_> *)0x0;
    a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (this->theArray).
              super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi;
    (this->theArray).
    super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         pvVar1;
    (this->theArray).
    super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var2._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      if (a_Stack_20[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_20[0]._M_pi);
      }
    }
  }
  return;
}

Assistant:

Array::Array(int sz) {
    totSize = sz;
    theSize = 0;
    if (sz > 0) {
        theArray = make_shared<vint>(sz);
    }
}